

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result spvc_compiler_get_active_interface_variables(spvc_compiler compiler,spvc_set *set)

{
  spvc_context_s *this;
  spvc_result sVar1;
  spvc_set psVar2;
  _Head_base<0UL,_ScratchMemoryAllocation_*,_false> local_80;
  string local_78;
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  active;
  
  psVar2 = (spvc_set)operator_new(0x40,(nothrow_t *)&std::nothrow);
  if (psVar2 == (spvc_set)0x0) {
    this = compiler->context;
    std::__cxx11::string::string((string *)&local_78,"Out of memory.",(allocator *)&active);
    spvc_context_s::report_error(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    sVar1 = SPVC_ERROR_OUT_OF_MEMORY;
  }
  else {
    (psVar2->super_ScratchMemoryAllocation)._vptr_ScratchMemoryAllocation =
         (_func_int **)&PTR__spvc_set_s_0039da38;
    (psVar2->set)._M_h._M_buckets = &(psVar2->set)._M_h._M_single_bucket;
    (psVar2->set)._M_h._M_bucket_count = 1;
    (psVar2->set)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (psVar2->set)._M_h._M_element_count = 0;
    (psVar2->set)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (psVar2->set)._M_h._M_rehash_policy._M_next_resize = 0;
    (psVar2->set)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    spirv_cross::Compiler::get_active_interface_variables
              (&active,(compiler->compiler)._M_t.
                       super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                       .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
    std::
    _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::operator=(&(psVar2->set)._M_h,&active._M_h);
    *set = psVar2;
    local_80._M_head_impl = (ScratchMemoryAllocation *)psVar2;
    spirv_cross::
    SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
    ::push_back(&compiler->context->allocations,
                (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                 *)&local_80);
    if ((spvc_set)local_80._M_head_impl != (spvc_set)0x0) {
      (*((ScratchMemoryAllocation *)&(local_80._M_head_impl)->_vptr_ScratchMemoryAllocation)->
        _vptr_ScratchMemoryAllocation[1])();
    }
    std::
    _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&active._M_h);
    sVar1 = SPVC_SUCCESS;
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_get_active_interface_variables(spvc_compiler compiler, spvc_set *set)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_set_s> ptr(new (std::nothrow) spvc_set_s);
		if (!ptr)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		auto active = compiler->compiler->get_active_interface_variables();
		ptr->set = std::move(active);
		*set = ptr.get();
		compiler->context->allocations.push_back(std::move(ptr));
	}